

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

curl_off_t encoder_base64_size(curl_mimepart *part)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  
  lVar3 = part->datasize;
  if (0 < lVar3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = lVar3 - 1U;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lVar3 - 1U;
    lVar3 = (SUB168(auVar2 * ZEXT816(0x8fb823ee08fb823f),8) >> 4 & 0xfffffffffffffffe) +
            (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) * 2 + 4;
  }
  return lVar3;
}

Assistant:

static curl_off_t encoder_base64_size(curl_mimepart *part)
{
  curl_off_t size = part->datasize;

  if(size <= 0)
    return size;    /* Unknown size or no data. */

  /* Compute base64 character count. */
  size = 4 * (1 + (size - 1) / 3);

  /* Effective character count must include CRLFs. */
  return size + 2 * ((size - 1) / MAX_ENCODED_LINE_LENGTH);
}